

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

void __thiscall
branch_and_reduce_algorithm::addStartingSolution
          (branch_and_reduce_algorithm *this,vector<int,_std::allocator<int>_> *solution,
          int solutionSize)

{
  ostream *poVar1;
  pointer piVar2;
  long lVar3;
  pointer piVar4;
  ulong uVar5;
  
  piVar2 = (solution->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar3 = (long)(solution->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  piVar4 = (this->y).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (lVar3 != (long)(this->y).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar4) {
    poVar1 = std::operator<<((ostream *)&std::cout,"ERROR: invalid solution std::vector!");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ostream::flush();
    piVar2 = (solution->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->y).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    lVar3 = (long)(solution->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar2;
  }
  for (uVar5 = 0; uVar5 < (ulong)(lVar3 >> 2); uVar5 = uVar5 + 1) {
    piVar4[uVar5] = piVar2[uVar5];
  }
  this->opt = solutionSize;
  this->startingSolutionIsBest = true;
  this->numBranchesPrunedByStartingSolution = 0;
  return;
}

Assistant:

void branch_and_reduce_algorithm::addStartingSolution(std::vector<int> solution, int solutionSize)
{
    if (solution.size() != y.size())
    {
        cout << "ERROR: invalid solution std::vector!" << endl
             << flush;
    }
    for (int i = 0; i < solution.size(); ++i)
    {
        y[i] = solution[i];
    }
    opt = solutionSize;

    startingSolutionIsBest = true;
    numBranchesPrunedByStartingSolution = 0;
}